

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructureExtendLevel(int *pRc,Fts5Structure *pStruct,int iLvl,int nExtra,int bInsert)

{
  int iVar1;
  Fts5StructureSegment *__src;
  Fts5StructureSegment *pFVar2;
  
  if (*pRc != 0) {
    return;
  }
  __src = (Fts5StructureSegment *)
          sqlite3_realloc64(pStruct->aLevel[iLvl].aSeg,
                            (long)pStruct->aLevel[iLvl].nSeg * 0x38 + 0x38);
  if (__src == (Fts5StructureSegment *)0x0) {
    *pRc = 7;
  }
  else {
    iVar1 = pStruct->aLevel[iLvl].nSeg;
    if (nExtra == 0) {
      pFVar2 = __src + iVar1;
    }
    else {
      memmove(__src + 1,__src,(long)(iVar1 * 0x38));
      pFVar2 = __src;
    }
    *(undefined8 *)&pFVar2->nPgTombstone = 0;
    pFVar2->nEntryTombstone = 0;
    pFVar2->iOrigin1 = 0;
    pFVar2->iOrigin2 = 0;
    pFVar2->iSegid = 0;
    pFVar2->pgnoFirst = 0;
    *(undefined8 *)&pFVar2->pgnoLast = 0;
    pFVar2->nEntry = 0;
    pStruct->aLevel[iLvl].aSeg = __src;
  }
  return;
}

Assistant:

static void fts5StructureExtendLevel(
  int *pRc,
  Fts5Structure *pStruct,
  int iLvl,
  int nExtra,
  int bInsert
){
  if( *pRc==SQLITE_OK ){
    Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
    Fts5StructureSegment *aNew;
    sqlite3_int64 nByte;

    nByte = (pLvl->nSeg + nExtra) * sizeof(Fts5StructureSegment);
    aNew = sqlite3_realloc64(pLvl->aSeg, nByte);
    if( aNew ){
      if( bInsert==0 ){
        memset(&aNew[pLvl->nSeg], 0, sizeof(Fts5StructureSegment) * nExtra);
      }else{
        int nMove = pLvl->nSeg * sizeof(Fts5StructureSegment);
        memmove(&aNew[nExtra], aNew, nMove);
        memset(aNew, 0, sizeof(Fts5StructureSegment) * nExtra);
      }
      pLvl->aSeg = aNew;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}